

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::SeparateProgramsTessControl::Run(SeparateProgramsTessControl *this)

{
  uint uVar1;
  char *pcVar2;
  uint program;
  mapped_type *pmVar3;
  allocator<char> local_479;
  key_type local_478;
  undefined8 uStack_458;
  GLint expected3 [12];
  GLenum props3 [12];
  allocator<char> local_3e9;
  key_type local_3e8;
  undefined8 uStack_3c8;
  GLint expected2 [10];
  undefined8 uStack_398;
  GLenum props2 [10];
  allocator<char> local_361;
  string local_360 [39];
  allocator<char> local_339;
  key_type local_338;
  allocator<char> local_311;
  string local_310 [39];
  allocator<char> local_2e9;
  key_type local_2e8;
  allocator<char> local_2c1;
  string local_2c0 [39];
  allocator<char> local_299;
  key_type local_298;
  allocator<char> local_271;
  string local_270 [39];
  allocator<char> local_249;
  key_type local_248;
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  key_type local_1f8;
  allocator<char> local_1d1;
  string local_1d0 [39];
  allocator<char> local_1a9;
  key_type local_1a8;
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [55];
  allocator<char> local_a9;
  string local_a8 [32];
  undefined1 local_88 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesO;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesI;
  char *pcStack_20;
  GLuint tcs;
  char *srcTCS;
  long error;
  SeparateProgramsTessControl *this_local;
  
  srcTCS = (char *)0x0;
  pcStack_20 = 
  "#version 430                                                  \nlayout(vertices = 3) out;                                     \nlayout(location = 0) patch out vec4 data;                     \nout gl_PerVertex {                                            \n   vec4 gl_Position;                                          \n   float gl_PointSize;                                        \n   float gl_ClipDistance[];                                   \n} gl_out[];                                                   \nin Color {                                 \n  float r, g, b;                           \n  vec4 iLikePie;                           \n} vs_color[];                              \nvoid main() {                                                                   \n   data = vec4(1);                                                              \n   gl_out[gl_InvocationID].gl_Position =                                        \n           vec4(vs_color[0].r, vs_color[0].g, vs_color[0].b, vs_color[0].iLikePie.x + float(gl_InvocationID));       \n   gl_TessLevelInner[0] = 1.0;                                                  \n   gl_TessLevelInner[1] = 1.0;                                                  \n   gl_TessLevelOuter[0] = 1.0;                                                  \n   gl_TessLevelOuter[1] = 1.0;                                                  \n   gl_TessLevelOuter[2] = 1.0;                                                  \n}"
  ;
  error = (long)this;
  program = (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.
              super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x18])
                      (this,0x8e88,1,&stack0xffffffffffffffe0);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e3,0x92f6,0x10);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e3,0x92f5,5,&srcTCS);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a8,"gl_PerVertex.gl_Position",&local_a9);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e4,local_88,local_a8,&srcTCS);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"data",&local_e1);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e4,local_88,local_e0,&srcTCS);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"Color.r",&local_109);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e3,&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count,
             local_108,&srcTCS);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"Color.g",&local_131);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e3,&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count,
             local_130,&srcTCS);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"Color.b",&local_159);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e3,&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count,
             local_158,&srcTCS);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_180,"Color.iLikePie",&local_181);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e3,&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count,
             local_180,&srcTCS);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"gl_PerVertex.gl_Position",&local_1a9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_88,&local_1a8);
  uVar1 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d0,"gl_PerVertex.gl_Position",&local_1d1);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e4,(ulong)uVar1,local_1d0,&srcTCS);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"data",&local_1f9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_88,&local_1f8);
  uVar1 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_220,"data",&local_221);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e4,(ulong)uVar1,local_220,&srcTCS);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"Color.r",&local_249);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_248);
  uVar1 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_270,"Color.r",&local_271);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e3,(ulong)uVar1,local_270,&srcTCS);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"Color.g",&local_299);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_298);
  uVar1 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2c0,"Color.g",&local_2c1);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e3,(ulong)uVar1,local_2c0,&srcTCS);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"Color.b",&local_2e9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_2e8);
  uVar1 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_310,"Color.b",&local_311);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e3,(ulong)uVar1,local_310,&srcTCS);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator(&local_311);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"Color.iLikePie",&local_339);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_338);
  uVar1 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_360,"Color.iLikePie",&local_361);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e3,(ulong)uVar1,local_360,&srcTCS);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator(&local_361);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  props2[6] = 0x9306;
  props2[7] = 0x92e7;
  props2[2] = 0x930a;
  props2[3] = 0x9309;
  props2[4] = 0x9307;
  props2[5] = 0x9308;
  uStack_398 = 0x92fa000092f9;
  props2[0] = 0x92fb;
  props2[1] = 0x930b;
  expected2[2] = 0;
  expected2[3] = 0;
  expected2[6] = 0;
  expected2[7] = 0;
  uStack_3c8 = 0x8b520000000f;
  expected2[0] = 1;
  expected2[1] = 0;
  expected2[4] = 1;
  expected2[5] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"Color.iLikePie",&local_3e9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_3e8);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e3,(ulong)*pmVar3,10,&uStack_398,10,&uStack_3c8,&srcTCS);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  expected3[10] = 0x92f9;
  expected3[0xb] = 0x92fa;
  expected3[2] = 0;
  expected3[3] = 0;
  uStack_458 = 0x8b5200000005;
  expected3[0] = 1;
  expected3[1] = 0;
  expected3[4] = 1;
  expected3[5] = 0;
  expected3[6] = 0;
  expected3[7] = 1;
  expected3[8] = 0;
  expected3[9] = -1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"data",&local_479);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_88,&local_478);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e4,(ulong)*pmVar3,0xc,expected3 + 10,0xc,&uStack_458,&srcTCS);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.
              super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,program);
  pcVar2 = srcTCS;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)local_88);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return (long)pcVar2;
}

Assistant:

virtual long Run()
	{
		long error = NO_ERROR;

		const char* srcTCS = "#version 430                                                  \n"
							 "layout(vertices = 3) out;                                     \n"
							 "layout(location = 0) patch out vec4 data;                     \n"
							 "out gl_PerVertex {                                            \n"
							 "   vec4 gl_Position;                                          \n"
							 "   float gl_PointSize;                                        \n"
							 "   float gl_ClipDistance[];                                   \n"
							 "} gl_out[];                                                   \n"
							 ""
							 "in Color {                                 \n"
							 "  float r, g, b;                           \n"
							 "  vec4 iLikePie;                           \n"
							 "} vs_color[];                              \n"
							 ""
							 "void main() {                                                                   \n"
							 "   data = vec4(1);                                                              \n"
							 "   gl_out[gl_InvocationID].gl_Position =                                        \n"
							 "           vec4(vs_color[0].r, vs_color[0].g, vs_color[0].b, vs_color[0].iLikePie.x + "
							 "float(gl_InvocationID));       \n"
							 "   gl_TessLevelInner[0] = 1.0;                                                  \n"
							 "   gl_TessLevelInner[1] = 1.0;                                                  \n"
							 "   gl_TessLevelOuter[0] = 1.0;                                                  \n"
							 "   gl_TessLevelOuter[1] = 1.0;                                                  \n"
							 "   gl_TessLevelOuter[2] = 1.0;                                                  \n"
							 "}";

		const GLuint tcs = CreateShaderProgram(GL_TESS_CONTROL_SHADER, 1, &srcTCS);

		// gl_InvocationID should be included
		VerifyGetProgramInterfaceiv(tcs, GL_PROGRAM_INPUT, GL_MAX_NAME_LENGTH, 16, error);
		VerifyGetProgramInterfaceiv(tcs, GL_PROGRAM_INPUT, GL_ACTIVE_RESOURCES, 5, error);

		std::map<std::string, GLuint> indicesI;
		std::map<std::string, GLuint> indicesO;
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_OUTPUT, indicesO, "gl_PerVertex.gl_Position", error);
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_OUTPUT, indicesO, "data", error);
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_INPUT, indicesI, "Color.r", error);
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_INPUT, indicesI, "Color.g", error);
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_INPUT, indicesI, "Color.b", error);
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_INPUT, indicesI, "Color.iLikePie", error);

		VerifyGetProgramResourceName(tcs, GL_PROGRAM_OUTPUT, indicesO["gl_PerVertex.gl_Position"],
									 "gl_PerVertex.gl_Position", error);
		VerifyGetProgramResourceName(tcs, GL_PROGRAM_OUTPUT, indicesO["data"], "data", error);
		VerifyGetProgramResourceName(tcs, GL_PROGRAM_INPUT, indicesI["Color.r"], "Color.r", error);
		VerifyGetProgramResourceName(tcs, GL_PROGRAM_INPUT, indicesI["Color.g"], "Color.g", error);
		VerifyGetProgramResourceName(tcs, GL_PROGRAM_INPUT, indicesI["Color.b"], "Color.b", error);
		VerifyGetProgramResourceName(tcs, GL_PROGRAM_INPUT, indicesI["Color.iLikePie"], "Color.iLikePie", error);

		GLenum props2[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_GEOMETRY_SHADER,
							GL_REFERENCED_BY_TESS_CONTROL_SHADER,
							GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_IS_PER_PATCH };
		GLint expected2[] = { 15, GL_FLOAT_VEC4, 1, 0, 0, 0, 1, 0, 0, 0 };
		VerifyGetProgramResourceiv(tcs, GL_PROGRAM_INPUT, indicesI["Color.iLikePie"], 10, props2, 10, expected2, error);

		GLenum props3[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_GEOMETRY_SHADER,
							GL_REFERENCED_BY_TESS_CONTROL_SHADER,
							GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_IS_PER_PATCH,
							GL_LOCATION,
							GL_LOCATION_INDEX };
		GLint expected3[] = { 5, GL_FLOAT_VEC4, 1, 0, 0, 0, 1, 0, 0, 1, 0, -1 };
		VerifyGetProgramResourceiv(tcs, GL_PROGRAM_OUTPUT, indicesO["data"], 12, props3, 12, expected3, error);

		glDeleteProgram(tcs);
		return error;
	}